

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void multi_getsock(Curl_easy *data,easy_pollset *ps)

{
  code *get_socks_cb;
  
  Curl_pollset_reset(data,ps);
  if (data->conn == (connectdata *)0x0) {
switchD_005e1e1f_caseD_0:
    return;
  }
  switch(data->mstate) {
  case MSTATE_INIT:
  case MSTATE_PENDING:
  case MSTATE_CONNECT:
  case MSTATE_RATELIMITING:
  case MSTATE_DONE:
  case MSTATE_COMPLETED:
  case MSTATE_MSGSENT:
    goto switchD_005e1e1f_caseD_0;
  case MSTATE_RESOLVING:
    Curl_pollset_add_socks(data,ps,Curl_resolv_getsock);
    return;
  case MSTATE_CONNECTING:
  case MSTATE_TUNNELING:
    get_socks_cb = connecting_getsock;
    break;
  case MSTATE_PROTOCONNECT:
  case MSTATE_PROTOCONNECTING:
    get_socks_cb = protocol_getsock;
    break;
  case MSTATE_DO:
  case MSTATE_DOING:
    get_socks_cb = doing_getsock;
    break;
  case MSTATE_DOING_MORE:
    get_socks_cb = domore_getsock;
    break;
  case MSTATE_DID:
  case MSTATE_PERFORMING:
    get_socks_cb = perform_getsock;
    break;
  default:
    Curl_failf(data,"multi_getsock: unexpected multi state %d");
    return;
  }
  Curl_pollset_add_socks(data,ps,get_socks_cb);
  Curl_conn_adjust_pollset(data,ps);
  return;
}

Assistant:

static void multi_getsock(struct Curl_easy *data,
                          struct easy_pollset *ps)
{
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  Curl_pollset_reset(data, ps);
  if(!data->conn)
    return;

  switch(data->mstate) {
  case MSTATE_INIT:
  case MSTATE_PENDING:
  case MSTATE_CONNECT:
    /* nothing to poll for yet */
    break;

  case MSTATE_RESOLVING:
    Curl_pollset_add_socks(data, ps, Curl_resolv_getsock);
    /* connection filters are not involved in this phase */
    break;

  case MSTATE_CONNECTING:
  case MSTATE_TUNNELING:
    Curl_pollset_add_socks(data, ps, connecting_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_PROTOCONNECT:
  case MSTATE_PROTOCONNECTING:
    Curl_pollset_add_socks(data, ps, protocol_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_DO:
  case MSTATE_DOING:
    Curl_pollset_add_socks(data, ps, doing_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_DOING_MORE:
    Curl_pollset_add_socks(data, ps, domore_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_DID: /* same as PERFORMING in regard to polling */
  case MSTATE_PERFORMING:
    Curl_pollset_add_socks(data, ps, perform_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_RATELIMITING:
    /* we need to let time pass, ignore socket(s) */
    break;

  case MSTATE_DONE:
  case MSTATE_COMPLETED:
  case MSTATE_MSGSENT:
    /* nothing more to poll for */
    break;

  default:
    failf(data, "multi_getsock: unexpected multi state %d", data->mstate);
    DEBUGASSERT(0);
    break;
  }
}